

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_constructor_injection.cpp
# Opt level: O3

int main(void)

{
  return 0;
}

Assistant:

int main() {
  // clang-format off
  auto injector = di::make_injector(
    di::bind<int>().named(int1).to(42)
  , di::bind<int>().named(int2).to(87)
  );
  // clang-format on
  {
    auto object = injector.create<T>();
    assert(42 == object.a);
    assert(87 == object.b);
  }
  {
    auto object = T(42, 87);
    assert(42 == object.a);
    assert(87 == object.b);
  }
}